

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

void av1_init_level_info(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  AV1LevelInfo *__s;
  SequenceHeader *pSVar3;
  int i;
  long lVar4;
  uint32_t uVar5;
  long lVar6;
  DECODER_MODEL *pDVar7;
  long lVar8;
  double *pdVar9;
  int *piVar10;
  double dVar11;
  
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
    __s = (cpi->ppi->level_params).level_info[lVar6];
    if (__s != (AV1LevelInfo *)0x0) {
      memset(__s,0,0x107d0);
      (__s->level_spec).level = '\x1f';
      (__s->level_stats).min_frame_height = 0x7fffffff;
      (__s->level_stats).min_cropped_tile_width = 0x7fffffff;
      (__s->level_stats).min_cropped_tile_height = 0x7fffffff;
      (__s->level_stats).tile_width_is_valid = 1;
      (__s->level_stats).min_frame_width = 0x7fffffff;
      (__s->level_stats).min_cr = 100000000.0;
      (__s->frame_window_buffer).start = 0;
      iVar1 = (cpi->common).height;
      iVar2 = (cpi->common).superres_upscaled_width;
      pdVar9 = &__s->decoder_models[0].frame_buffer_pool[0].presentation_time;
      piVar10 = __s->decoder_models[0].vbi;
      for (lVar8 = 0; lVar8 != 0x1c; lVar8 = lVar8 + 1) {
        pDVar7 = __s->decoder_models + lVar8;
        if (((av1_level_defs[lVar8].max_h_size < iVar2) ||
            (av1_level_defs[lVar8].max_v_size < iVar1)) ||
           (av1_level_defs[lVar8].max_picture_size < iVar1 * iVar2)) {
          pDVar7->status = 7;
        }
        else {
          pDVar7->status = 0;
          pDVar7->level = (AV1_LEVEL)lVar8;
          pSVar3 = (cpi->common).seq_params;
          dVar11 = get_max_bitrate(av1_level_defs + lVar8,(uint)pSVar3->tier[lVar6],pSVar3->profile)
          ;
          pDVar7->bit_rate = dVar11;
          pDVar7->mode = '\0';
          pDVar7->is_low_delay_mode = false;
          pDVar7->encoder_buffer_delay = 20000;
          pDVar7->decoder_buffer_delay = 70000;
          pDVar7->first_bit_arrival_time = 0.0;
          pDVar7->last_bit_arrival_time = 0.0;
          pDVar7->coded_bits = 0;
          pDVar7->removal_time = -1.0;
          pDVar7->presentation_time = -1.0;
          pDVar7->max_decode_rate = 0.0;
          pDVar7->decode_samples = 0;
          pDVar7->display_samples = 0;
          pDVar7->max_display_rate = 0.0;
          pDVar7->num_frame = -1;
          pDVar7->num_decoded_frame = -1;
          pDVar7->num_shown_frame = -1;
          pDVar7->current_time = 0.0;
          for (lVar4 = 0; lVar4 != 0xf0; lVar4 = lVar4 + 0x18) {
            *(undefined8 *)((long)pdVar9 + lVar4 + -0x10) = 0;
            *(undefined4 *)((long)pdVar9 + lVar4 + -8) = 0xffffffff;
            *(undefined8 *)((long)pdVar9 + lVar4) = 0xbff0000000000000;
          }
          for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
            piVar10[lVar4] = -1;
          }
          (pDVar7->dfg_interval_queue).head = 0;
          (pDVar7->dfg_interval_queue).size = 0;
          *(double *)((long)&pDVar7->dfg_interval_queue + 8) = 0.0;
          if (pSVar3->timing_info_present == 0) {
            dVar11 = 1.0 / cpi->framerate;
            uVar5 = 1;
          }
          else {
            uVar5 = (pSVar3->timing_info).num_ticks_per_picture;
            dVar11 = (double)((ulong)(pSVar3->timing_info).num_units_in_display_tick /
                             (ulong)(pSVar3->timing_info).time_scale);
          }
          pDVar7->num_ticks_per_picture = uVar5;
          pDVar7->display_clock_tick = dVar11;
          pDVar7->initial_display_delay = pSVar3->op_params[lVar6].initial_display_delay;
          pDVar7->initial_presentation_delay = -1.0;
          pDVar7->decode_rate = av1_level_defs[lVar8].max_decode_rate;
        }
        pdVar9 = pdVar9 + 0xf6;
        piVar10 = piVar10 + 0x1ec;
      }
    }
  }
  return;
}

Assistant:

void av1_init_level_info(AV1_COMP *cpi) {
  for (int op_index = 0; op_index < MAX_NUM_OPERATING_POINTS; ++op_index) {
    AV1LevelInfo *const this_level_info =
        cpi->ppi->level_params.level_info[op_index];
    if (!this_level_info) continue;
    memset(this_level_info, 0, sizeof(*this_level_info));
    AV1LevelSpec *const level_spec = &this_level_info->level_spec;
    level_spec->level = SEQ_LEVEL_MAX;
    AV1LevelStats *const level_stats = &this_level_info->level_stats;
    level_stats->min_cropped_tile_width = INT_MAX;
    level_stats->min_cropped_tile_height = INT_MAX;
    level_stats->min_frame_width = INT_MAX;
    level_stats->min_frame_height = INT_MAX;
    level_stats->tile_width_is_valid = 1;
    level_stats->min_cr = 1e8;

    FrameWindowBuffer *const frame_window_buffer =
        &this_level_info->frame_window_buffer;
    frame_window_buffer->num = 0;
    frame_window_buffer->start = 0;

    const AV1_COMMON *const cm = &cpi->common;
    const int upscaled_width = cm->superres_upscaled_width;
    const int height = cm->height;
    const int pic_size = upscaled_width * height;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      DECODER_MODEL *const this_model = &this_level_info->decoder_models[level];
      const AV1LevelSpec *const spec = &av1_level_defs[level];
      if (upscaled_width > spec->max_h_size || height > spec->max_v_size ||
          pic_size > spec->max_picture_size) {
        // Turn off decoder model for this level as the frame size already
        // exceeds level constraints.
        this_model->status = DECODER_MODEL_DISABLED;
      } else {
        decoder_model_init(cpi, level, op_index, this_model);
      }
    }
  }
}